

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O0

void bufchain_add(bufchain *ch,void *data,size_t len)

{
  bufchain_granule *pbVar1;
  char *local_50;
  char *local_48;
  bufchain_granule *newbuf;
  size_t grainlen;
  size_t copylen;
  char *buf;
  size_t len_local;
  void *data_local;
  bufchain *ch_local;
  
  if (len != 0) {
    ch->buffersize = len + ch->buffersize;
    copylen = (size_t)data;
    buf = (char *)len;
    while (buf != (char *)0x0) {
      if ((ch->tail != (bufchain_granule *)0x0) && (ch->tail->bufend < ch->tail->bufmax)) {
        if (buf < ch->tail->bufmax + -(long)ch->tail->bufend) {
          local_48 = buf;
        }
        else {
          local_48 = ch->tail->bufmax + -(long)ch->tail->bufend;
        }
        memcpy(ch->tail->bufend,(void *)copylen,(size_t)local_48);
        copylen = (size_t)(local_48 + copylen);
        buf = buf + -(long)local_48;
        ch->tail->bufend = local_48 + (long)ch->tail->bufend;
      }
      if (buf != (char *)0x0) {
        if (buf + 0x20 < (char *)0x201) {
          local_50 = (char *)0x200;
        }
        else {
          local_50 = buf + 0x20;
        }
        pbVar1 = (bufchain_granule *)safemalloc((size_t)local_50,1,0);
        pbVar1->bufend = (char *)(pbVar1 + 1);
        pbVar1->bufpos = (char *)(pbVar1 + 1);
        pbVar1->bufmax = local_50 + (long)&pbVar1->next;
        pbVar1->next = (bufchain_granule *)0x0;
        if (ch->tail == (bufchain_granule *)0x0) {
          ch->head = pbVar1;
        }
        else {
          ch->tail->next = pbVar1;
        }
        ch->tail = pbVar1;
      }
    }
    if (ch->ic != (IdempotentCallback *)0x0) {
      (*ch->queue_idempotent_callback)(ch->ic);
    }
  }
  return;
}

Assistant:

void bufchain_add(bufchain *ch, const void *data, size_t len)
{
    const char *buf = (const char *)data;

    if (len == 0) return;

    ch->buffersize += len;

    while (len > 0) {
        if (ch->tail && ch->tail->bufend < ch->tail->bufmax) {
            size_t copylen = min(len, ch->tail->bufmax - ch->tail->bufend);
            memcpy(ch->tail->bufend, buf, copylen);
            buf += copylen;
            len -= copylen;
            ch->tail->bufend += copylen;
        }
        if (len > 0) {
            size_t grainlen =
                max(sizeof(struct bufchain_granule) + len, BUFFER_MIN_GRANULE);
            struct bufchain_granule *newbuf;
            newbuf = smalloc(grainlen);
            newbuf->bufpos = newbuf->bufend =
                (char *)newbuf + sizeof(struct bufchain_granule);
            newbuf->bufmax = (char *)newbuf + grainlen;
            newbuf->next = NULL;
            if (ch->tail)
                ch->tail->next = newbuf;
            else
                ch->head = newbuf;
            ch->tail = newbuf;
        }
    }

    if (ch->ic)
        ch->queue_idempotent_callback(ch->ic);
}